

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::connectEstablished(TcpConnection *this)

{
  Channel *this_00;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<void> local_38;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (this->m_state == kConnecting) {
    this->m_state = kConnected;
    this_00 = (this->m_channel)._M_t.
              super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
              _M_t.
              super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
              .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
    std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::TcpConnection,void>
              ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_48,
               (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_38.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_48;
    local_38.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_40._M_pi;
    _local_48 = ZEXT816(0) << 0x20;
    Channel::tie(this_00,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    Channel::enableReading
              ((this->m_channel)._M_t.
               super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
               ._M_t.
               super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
               .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl);
    if ((this->m_connectionCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<sznet::net::TcpConnection,void>
                ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_38,
                 (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
      std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator()
                (&this->m_connectionCallback,(shared_ptr<sznet::net::TcpConnection> *)&local_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_38.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    return;
  }
  __assert_fail("m_state == kConnecting",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                ,0x128,"void sznet::net::TcpConnection::connectEstablished()");
}

Assistant:

void TcpConnection::connectEstablished()
{
	m_loop->assertInLoopThread();
	assert(m_state == kConnecting);
	setState(kConnected);
	m_channel->tie(shared_from_this());
	m_channel->enableReading();

	if (m_connectionCallback)
	{
		m_connectionCallback(shared_from_this());
	}
}